

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O1

ostream * __thiscall GEO::Logger::err_stream(Logger *this,string *feature)

{
  size_t __n;
  int iVar1;
  
  if (this->quiet_ != false) goto LAB_0013bb92;
  __n = (this->current_feature_)._M_string_length;
  if (__n == feature->_M_string_length) {
    if (__n == 0) goto LAB_0013bb92;
    iVar1 = bcmp((this->current_feature_)._M_dataplus._M_p,(feature->_M_dataplus)._M_p,__n);
    if (iVar1 == 0) goto LAB_0013bb92;
  }
  this->current_feature_changed_ = true;
  std::__cxx11::string::_M_assign((string *)&this->current_feature_);
LAB_0013bb92:
  return &(this->err_).super_ostream;
}

Assistant:

std::ostream& Logger::err_stream(const std::string& feature) {
        if(!quiet_ && current_feature_ != feature) {
            current_feature_changed_ = true;
            current_feature_ = feature;
        }
        return err_;
    }